

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox.cpp
# Opt level: O3

ssize_t __thiscall zmq::mailbox_t::recv(mailbox_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  __pid_t _Var1;
  int iVar2;
  ssize_t sVar3;
  ssize_t sVar4;
  int *piVar5;
  int iVar6;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 extraout_EDX_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 in_register_00000034;
  void *__buf_00;
  void *__stat_loc;
  cpipe_t *this_00;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  if (this->_active == true) {
    sVar3 = ypipe_t<zmq::command_t,_16>::read(&this->_cpipe,__fd,__buf,__n);
    if ((char)sVar3 != '\0') {
      return 0;
    }
    this->_active = false;
  }
  __stat_loc = (void *)((ulong)__buf & 0xffffffff);
  _Var1 = signaler_t::wait(&this->_signaler,__stat_loc);
  iVar2 = (int)__n;
  if (_Var1 == -1) {
    piVar5 = __errno_location();
    iVar6 = *piVar5;
    sVar3 = 0xffffffff;
    if ((iVar6 != 4) && (iVar6 != 0xb)) {
      recv(iVar6,__stat_loc,CONCAT44(extraout_var_01,extraout_EDX_01),iVar2);
    }
  }
  else {
    iVar2 = signaler_t::recv_failable(&this->_signaler);
    iVar6 = (int)__n;
    if (iVar2 == -1) {
      piVar5 = __errno_location();
      sVar3 = 0xffffffff;
      if (*piVar5 != 0xb) {
        recv(*piVar5,__stat_loc,CONCAT44(extraout_var_02,extraout_EDX_02),iVar6);
      }
    }
    else {
      this->_active = true;
      this_00 = &this->_cpipe;
      sVar4 = ypipe_t<zmq::command_t,_16>::read
                        (this_00,__fd,(void *)CONCAT44(extraout_var,extraout_EDX),__n);
      sVar3 = 0;
      if ((char)sVar4 == '\0') {
        recv((int)this_00,__buf_00,CONCAT44(extraout_var_00,extraout_EDX_00),iVar6);
      }
    }
  }
  return sVar3;
}

Assistant:

int zmq::mailbox_t::recv (command_t *cmd_, int timeout_)
{
    //  Try to get the command straight away.
    if (_active) {
        if (_cpipe.read (cmd_))
            return 0;

        //  If there are no more commands available, switch into passive state.
        _active = false;
    }

    //  Wait for signal from the command sender.
    int rc = _signaler.wait (timeout_);
    if (rc == -1) {
        errno_assert (errno == EAGAIN || errno == EINTR);
        return -1;
    }

    //  Receive the signal.
    rc = _signaler.recv_failable ();
    if (rc == -1) {
        errno_assert (errno == EAGAIN);
        return -1;
    }

    //  Switch into active state.
    _active = true;

    //  Get a command.
    const bool ok = _cpipe.read (cmd_);
    zmq_assert (ok);
    return 0;
}